

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,6ul>
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *obj,
               array<unsigned_char,_6UL> *prefix)

{
  long lVar1;
  const_iterator __first2;
  size_type sVar2;
  const_iterator __first1;
  long in_FS_OFFSET;
  array<unsigned_char,_6UL> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffffc8);
  uVar3 = false;
  if (5 < sVar2) {
    __first1 = std::begin<std::array<unsigned_char,6ul>>(in_stack_ffffffffffffffb8);
    std::end<std::array<unsigned_char,6ul>>(in_stack_ffffffffffffffb8);
    std::begin<prevector<16u,unsigned_char,unsigned_int,int>>
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    __first2.ptr._7_1_ = uVar3;
    __first2.ptr._0_7_ = in_stack_ffffffffffffffd8;
    uVar3 = std::
            equal<unsigned_char_const*,prevector<16u,unsigned_char,unsigned_int,int>::const_iterator>
                      (__first1,(uchar *)CONCAT17(in_stack_ffffffffffffffc7,
                                                  in_stack_ffffffffffffffc0),__first2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] inline bool HasPrefix(const T1& obj,
                                const std::array<uint8_t, PREFIX_LEN>& prefix)
{
    return obj.size() >= PREFIX_LEN &&
           std::equal(std::begin(prefix), std::end(prefix), std::begin(obj));
}